

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O3

void anon_unknown.dwarf_21aebc::testMultiPartOutputFileForExpectedFailure
               (vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *headers,string *fn,
               string *failMessage)

{
  char *pcVar1;
  Header *pHVar2;
  pointer pHVar3;
  int iVar4;
  ostream *poVar5;
  MultiPartOutputFile file;
  MultiPartOutputFile local_30 [16];
  
  remove((fn->_M_dataplus)._M_p);
  pcVar1 = (fn->_M_dataplus)._M_p;
  pHVar2 = (headers->super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pHVar3 = (headers->super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
            (local_30,pcVar1,pHVar2,(int)((ulong)((long)pHVar3 - (long)pHVar2) >> 3) * -0x49249249,
             false,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR -- ",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(failMessage->_M_dataplus)._M_p,
                      failMessage->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartSharedAttributes.cpp"
                ,0x7e,
                "void (anonymous namespace)::testMultiPartOutputFileForExpectedFailure(const vector<Header> &, const std::string &, const string &)"
               );
}

Assistant:

void
testMultiPartOutputFileForExpectedFailure (
    const vector<Header>& headers,
    const std::string&    fn,
    const string&         failMessage = "")
{
    bool caught = false;

    try
    {
        remove (fn.c_str ());
        MultiPartOutputFile file (
            fn.c_str (), headers.data (), headers.size ());
        cerr << "ERROR -- " << failMessage << endl;
        assert (false);
    }
    catch (const IEX_NAMESPACE::ArgExc& e)
    {
        // expected behaviour
        caught = true;
    }
    assert (caught);
}